

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O2

void Extra_NpnTest2(void)

{
  int *pComp;
  int *pPerm;
  word t;
  word tMin;
  
  t = 0xa2222aaa08888000;
  pComp = Extra_GreyCodeSchedule(6);
  pPerm = Extra_PermSchedule(6);
  tMin = Extra_Truth6MinimumExact(0xa2222aaa08888000,pComp,pPerm);
  free(pPerm);
  free(pComp);
  Extra_PrintHex(_stdout,(uint *)&t,6);
  putchar(10);
  Extra_PrintHex(_stdout,(uint *)&tMin,6);
  putchar(10);
  return;
}

Assistant:

void Extra_NpnTest2()
{
    int * pComp, * pPerm;
    word tMin, t = ABC_CONST(0xa2222aaa08888000);
    pComp = Extra_GreyCodeSchedule( 6 );
    pPerm = Extra_PermSchedule( 6 );
    tMin  = Extra_Truth6MinimumExact( t, pComp, pPerm );
    ABC_FREE( pPerm );
    ABC_FREE( pComp );

    Extra_PrintHex( stdout, (unsigned *)&t,    6 ), printf( "\n" );
    Extra_PrintHex( stdout, (unsigned *)&tMin, 6 ), printf( "\n" );
}